

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunnonlinsol_fixedpoint.c
# Opt level: O0

int FPFunction(N_Vector y,N_Vector f,void *mem)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  realtype y3;
  realtype y2;
  realtype y1;
  void *mem_local;
  N_Vector f_local;
  N_Vector y_local;
  
  dVar4 = **(double **)((long)y->content + 0x10);
  dVar1 = *(double *)(*(long *)((long)y->content + 0x10) + 8);
  dVar3 = *(double *)(*(long *)((long)y->content + 0x10) + 0x10);
  dVar2 = cos(dVar1 * dVar3);
  **(double **)((long)f->content + 0x10) = dVar2 * 0.3333333333333333 + 0.16666666666666666;
  dVar3 = sin(dVar3);
  dVar3 = sqrt(dVar4 * dVar4 + dVar3 + 1.06);
  *(double *)(*(long *)((long)f->content + 0x10) + 8) = dVar3 * 0.1111111111111111 + -0.1;
  dVar4 = exp(-dVar4 * dVar1);
  *(double *)(*(long *)((long)f->content + 0x10) + 0x10) = dVar4 * -0.05 + -0.47359877559830005;
  return 0;
}

Assistant:

int FPFunction(N_Vector y, N_Vector f, void *mem)
{
  realtype y1, y2, y3;

  y1 = NV_Ith_S(y,0);
  y2 = NV_Ith_S(y,1);
  y3 = NV_Ith_S(y,2);

  NV_Ith_S(f,0) = (ONE/THREE) * cos(y2*y3) + (ONE/SIX);
  NV_Ith_S(f,1) = (ONE/NINE) * sqrt(y1*y1 + sin(y3) + ONEPTZEROSIX) - PTONE;
  NV_Ith_S(f,2) = -(ONE/TWENTY) * exp(-y1*y2) - (TEN * PI - THREE) / SIXTY;

  return(0);
}